

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-utils.cpp
# Opt level: O0

void wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness::
     doVisitLocalSet(ParamLiveness*,wasm::Expression___(ParamLiveness *self,Expression **currp)

{
  bool bVar1;
  LocalSet *pLVar2;
  Function *this;
  LocalSet *set;
  Expression **currp_local;
  ParamLiveness *self_local;
  
  pLVar2 = Expression::cast<wasm::LocalSet>(*currp);
  if ((self->super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>).
      super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
      currBasicBlock != (BasicBlock *)0x0) {
    this = Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::getFunction
                     ((Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_> *)self);
    bVar1 = Function::isParam(this,pLVar2->index);
    if (bVar1) {
      LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::doVisitLocalSet
                (self,currp);
    }
  }
  return;
}

Assistant:

static void doVisitLocalSet(ParamLiveness* self, Expression** currp) {
      auto* set = (*currp)->cast<LocalSet>();
      if (self->currBasicBlock && self->getFunction()->isParam(set->index)) {
        Super::doVisitLocalSet(self, currp);
      }
    }